

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

double __thiscall ANN::accuracy(ANN *this,DataSet *dataSet)

{
  bool bVar1;
  Shape SVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  vector<double,_std::allocator<double>_> *vec2;
  uint index;
  uint uVar4;
  double output;
  uint local_80;
  Matrix local_70;
  Matrix local_50;
  
  SVar2 = DataSet::shape(dataSet);
  uVar4 = 0;
  for (index = 0; local_80 = SVar2.field_0._0_4_, local_80 != index; index = index + 1) {
    pvVar3 = DataSet::get_input(dataSet,index);
    feed_forward(&local_50,this,pvVar3);
    pvVar3 = Matrix::operator[](&local_50,0);
    output = DataSet::get_output(dataSet,index);
    DataSet::one_hot_encode(&local_70,output,2);
    vec2 = Matrix::operator[](&local_70,0);
    bVar1 = is_same(pvVar3,vec2);
    Matrix::~Matrix(&local_70);
    Matrix::~Matrix(&local_50);
    uVar4 = uVar4 + bVar1;
  }
  return (double)uVar4 / (double)((ulong)SVar2.field_0 & 0xffffffff);
}

Assistant:

double ANN::accuracy(const DataSet& dataSet){
    uint right_guesses=0;
    uint all_guesses=dataSet.shape().n_row;
    
    for(uint i=0;i<all_guesses;++i){
        if(is_same(feed_forward(dataSet.get_input(i))[0], DataSet::one_hot_encode(dataSet.get_output(i), 2)[0]))
            ++right_guesses;
    }

    return (double)right_guesses/all_guesses;
}